

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::FramebufferGLImpl::FramebufferGLImpl
          (FramebufferGLImpl *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDevice,
          FramebufferDesc *Desc,GLContextState *CtxState)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar5;
  ulong uVar6;
  Uint32 NumRenderTargets;
  uint uVar7;
  ulong uVar8;
  TextureViewGLImpl *pTVar9;
  TextureViewGLImpl *ppRsvlViews [8];
  TextureViewGLImpl *ppRTVs [8];
  GLFrameBufferObj local_118;
  GLFrameBufferObj local_f8;
  GLFrameBufferObj local_d8;
  TextureViewGLImpl *local_b8 [17];
  long lVar4;
  
  FramebufferBase<Diligent::EngineGLImplTraits>::FramebufferBase
            (&this->super_FramebufferBase<Diligent::EngineGLImplTraits>,pRefCounters,pDevice,Desc,
             false);
  (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
  .super_ObjectBase<Diligent::IFramebuffer>.super_RefCountedObject<Diligent::IFramebuffer>.
  super_IFramebuffer.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_00425d50;
  (this->m_SubpassFramebuffers).
  super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SubpassFramebuffers).
  super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SubpassFramebuffers).
  super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*(((this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              .m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  std::
  vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ::reserve(&this->m_SubpassFramebuffers,(ulong)*(uint *)(lVar4 + 0x18));
  if (*(int *)(lVar4 + 0x18) != 0) {
    uVar6 = 0;
    do {
      lVar1 = *(long *)(lVar4 + 0x20) + uVar6 * 0x48;
      local_b8[0xe] = (TextureViewGLImpl *)0x0;
      local_b8[0xf] = (TextureViewGLImpl *)0x0;
      local_b8[0xc] = (TextureViewGLImpl *)0x0;
      local_b8[0xd] = (TextureViewGLImpl *)0x0;
      local_b8[10] = (TextureViewGLImpl *)0x0;
      local_b8[0xb] = (TextureViewGLImpl *)0x0;
      local_b8[8] = (TextureViewGLImpl *)0x0;
      local_b8[9] = (TextureViewGLImpl *)0x0;
      uVar7 = *(uint *)(lVar1 + 0x10);
      NumRenderTargets = 0;
      if (uVar7 != 0) {
        uVar8 = 0;
        do {
          uVar5 = (ulong)*(uint *)(*(long *)(lVar1 + 0x18) + uVar8 * 8);
          if (uVar5 != 0xffffffff) {
            pTVar9 = (TextureViewGLImpl *)
                     (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                     .m_Desc.ppAttachments[uVar5];
            if (pTVar9 != (TextureViewGLImpl *)0x0) {
              CheckDynamicType<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                        ((ITextureView *)pTVar9);
              uVar7 = *(uint *)(lVar1 + 0x10);
            }
            local_b8[uVar8 + 8] = pTVar9;
          }
          uVar8 = uVar8 + 1;
          NumRenderTargets = uVar7;
        } while (uVar8 < uVar7);
      }
      if (*(uint **)(lVar1 + 0x28) == (uint *)0x0) {
        pTVar9 = (TextureViewGLImpl *)0x0;
      }
      else {
        uVar8 = (ulong)**(uint **)(lVar1 + 0x28);
        if ((uVar8 == 0xffffffff) ||
           (pTVar9 = (TextureViewGLImpl *)
                     (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                     .m_Desc.ppAttachments[uVar8], pTVar9 == (TextureViewGLImpl *)0x0)) {
          pTVar9 = (TextureViewGLImpl *)0x0;
        }
        else {
          CheckDynamicType<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                    ((ITextureView *)pTVar9);
          NumRenderTargets = *(Uint32 *)(lVar1 + 0x10);
        }
      }
      bVar2 = UseDefaultFBO(NumRenderTargets,local_b8 + 8,pTVar9);
      if (bVar2) {
        local_d8.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_uiHandle = 0;
        local_d8.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
        m_CreateReleaseHelper.m_ExternalFBOHandle = 0;
        local_d8.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_UniqueId.m_ID = 0;
        local_d8.m_NumDrawBuffers = 0xffffffff;
        local_d8.m_DrawBuffersMask = 0;
      }
      else {
        FBOCache::CreateFBO(&local_d8,CtxState,*(Uint32 *)(lVar1 + 0x10),local_b8 + 8,pTVar9,
                            Desc->Width,Desc->Height);
      }
      local_f8.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_uiHandle = 0;
      local_f8.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_CreateReleaseHelper.
      m_ExternalFBOHandle = 0;
      local_f8.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_UniqueId.m_ID = 0;
      local_f8.m_NumDrawBuffers = 0xffffffff;
      local_f8.m_DrawBuffersMask = 0;
      if (*(long *)(lVar1 + 0x20) != 0) {
        local_b8[6] = (TextureViewGLImpl *)0x0;
        local_b8[7] = (TextureViewGLImpl *)0x0;
        local_b8[4] = (TextureViewGLImpl *)0x0;
        local_b8[5] = (TextureViewGLImpl *)0x0;
        local_b8[2] = (TextureViewGLImpl *)0x0;
        local_b8[3] = (TextureViewGLImpl *)0x0;
        local_b8[0] = (TextureViewGLImpl *)0x0;
        local_b8[1] = (TextureViewGLImpl *)0x0;
        uVar7 = *(uint *)(lVar1 + 0x10);
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          uVar8 = 0;
          do {
            uVar5 = (ulong)*(uint *)(*(long *)(lVar1 + 0x20) + uVar8 * 8);
            if (uVar5 != 0xffffffff) {
              pTVar9 = (TextureViewGLImpl *)
                       (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                       super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                       .m_Desc.ppAttachments[uVar5];
              if (pTVar9 != (TextureViewGLImpl *)0x0) {
                CheckDynamicType<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                          ((ITextureView *)pTVar9);
                uVar7 = *(uint *)(lVar1 + 0x10);
              }
              local_b8[uVar8] = pTVar9;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < uVar7);
        }
        bVar2 = UseDefaultFBO(uVar7,local_b8,(TextureViewGLImpl *)0x0);
        if (bVar2) {
          local_118.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_uiHandle = 0;
          local_118.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
          m_CreateReleaseHelper.m_ExternalFBOHandle = 0;
          local_118.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_UniqueId.m_ID =
               0;
          local_118.m_NumDrawBuffers = 0xffffffff;
          local_118.m_DrawBuffersMask = 0;
        }
        else {
          FBOCache::CreateFBO(&local_118,CtxState,*(Uint32 *)(lVar1 + 0x10),local_b8,
                              (TextureViewGLImpl *)0x0,Desc->Width,Desc->Height);
        }
        GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::operator=
                  (&local_f8.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>,
                   &local_118.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
        local_f8.m_NumDrawBuffers = local_118.m_NumDrawBuffers;
        local_f8.m_DrawBuffersMask = local_118.m_DrawBuffersMask;
        local_118.m_NumDrawBuffers = 0;
        local_118.m_DrawBuffersMask = 0;
        GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
                  (&local_118.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
      }
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::SetName
                (&local_d8.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>,
                 (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                 super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                 .m_Desc.super_DeviceObjectAttribs.Name);
      std::
      vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>>
      ::emplace_back<GLObjectWrappers::GLFrameBufferObj,GLObjectWrappers::GLFrameBufferObj>
                ((vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>>
                  *)&this->m_SubpassFramebuffers,&local_d8,&local_f8);
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
                (&local_f8.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
                (&local_d8.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
      uVar6 = uVar6 + 1;
    } while (uVar6 < *(uint *)(lVar4 + 0x18));
  }
  return;
}

Assistant:

FramebufferGLImpl::FramebufferGLImpl(IReferenceCounters*    pRefCounters,
                                     RenderDeviceGLImpl*    pDevice,
                                     const FramebufferDesc& Desc,
                                     GLContextState&        CtxState) :
    TFramebufferBase{pRefCounters, pDevice, Desc}
{
    const auto& RPDesc = m_Desc.pRenderPass->GetDesc();
    m_SubpassFramebuffers.reserve(RPDesc.SubpassCount);
    for (Uint32 subpass = 0; subpass < RPDesc.SubpassCount; ++subpass)
    {
        const auto& SubpassDesc = RPDesc.pSubpasses[subpass];

        TextureViewGLImpl* ppRTVs[MAX_RENDER_TARGETS] = {};
        TextureViewGLImpl* pDSV                       = nullptr;

        for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
        {
            const auto& RTAttachmentRef = SubpassDesc.pRenderTargetAttachments[rt];
            if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                ppRTVs[rt] = ClassPtrCast<TextureViewGLImpl>(m_Desc.ppAttachments[RTAttachmentRef.AttachmentIndex]);
            }
        }

        if (SubpassDesc.pDepthStencilAttachment != nullptr && SubpassDesc.pDepthStencilAttachment->AttachmentIndex != ATTACHMENT_UNUSED)
        {
            pDSV = ClassPtrCast<TextureViewGLImpl>(m_Desc.ppAttachments[SubpassDesc.pDepthStencilAttachment->AttachmentIndex]);
        }
        auto RenderTargetFBO = UseDefaultFBO(SubpassDesc.RenderTargetAttachmentCount, ppRTVs, pDSV) ?
            GLObjectWrappers::GLFrameBufferObj{false} :
            FBOCache::CreateFBO(CtxState, SubpassDesc.RenderTargetAttachmentCount, ppRTVs, pDSV, Desc.Width, Desc.Height);

        GLObjectWrappers::GLFrameBufferObj ResolveFBO{false};
        if (SubpassDesc.pResolveAttachments != nullptr)
        {
            TextureViewGLImpl* ppRsvlViews[MAX_RENDER_TARGETS] = {};
            for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
            {
                const auto& RslvAttachmentRef = SubpassDesc.pResolveAttachments[rt];
                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                {
                    ppRsvlViews[rt] = ClassPtrCast<TextureViewGLImpl>(m_Desc.ppAttachments[RslvAttachmentRef.AttachmentIndex]);
                }
            }
            ResolveFBO = UseDefaultFBO(SubpassDesc.RenderTargetAttachmentCount, ppRsvlViews, nullptr) ?
                GLObjectWrappers::GLFrameBufferObj{false} :
                FBOCache::CreateFBO(CtxState, SubpassDesc.RenderTargetAttachmentCount, ppRsvlViews, nullptr, Desc.Width, Desc.Height);
        }

        RenderTargetFBO.SetName(m_Desc.Name);

        m_SubpassFramebuffers.emplace_back(std::move(RenderTargetFBO), std::move(ResolveFBO));
    }
}